

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomSphere *sphere,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *attr;
  uint32_t indent_00;
  string *psVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  string local_340;
  string local_320;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  GeomSphere *pGStack_18;
  uint32_t indent_local;
  GeomSphere *sphere_local;
  
  local_1c = (uint)sphere;
  local_1d = (byte)indent & 1;
  psVar3 = __return_storage_ptr__;
  pGStack_18 = (GeomSphere *)this;
  sphere_local = (GeomSphere *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar3;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(pGStack_18->super_GPrim).spec,s);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2," Sphere \"");
  poVar2 = std::operator<<(poVar2,(string *)&(pGStack_18->super_GPrim).name);
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&(pGStack_18->super_GPrim).meta);
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_208);
    std::operator<<(poVar2,"(\n");
    std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&(pGStack_18->super_GPrim).meta,
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    std::operator<<(aoStack_198,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_248);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_
            ((string *)&table._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (pprint *)(ulong)local_1c,n_02);
  poVar2 = std::operator<<(aoStack_198,
                           (string *)&table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_298);
  attr = &pGStack_18->radius;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"radius",&local_2d9);
  print_typed_attr<double>(&local_2b8,attr,&local_2d8,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  print_gprim_predefined<tinyusdz::GeomSphere>(&local_300,pGStack_18,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  print_props(&local_320,&(pGStack_18->super_GPrim).props,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_340,(pprint *)(ulong)local_1c,n_03);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_340);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_340);
  }
  std::__cxx11::stringstream::str();
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_298);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomSphere &sphere, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(sphere.spec) << " Sphere \""
     << sphere.name << "\"\n";
  if (sphere.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(sphere.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  std::set<std::string> table;

#if 0 // TODO
  if (sphere.propertyNames().size()) {
    // pxrUSD sorts property, so does TinyUSDZ also.
    std::vector<std::string> sortedPropertyNames;
    for (size_t i = 0; i < sphere.propertyNames().size(); i++) {
      sortedPropertyNames.push_back(sphere.propertyNames()[i].str());
    }
    std::sort(sortedPropertyNames.begin(), sortedPropertyNames.end());

    for (size_t i = 0; i < sortedPropertyNames.size(); i++) {
      std::string propName = sortedPropertyNames[i];

      PRINT_TYPED_ATTR(table, propName, sphere.radius, "radius", indent + 1)

      if (emit_gprim_predefined(ss, &sphere, propName, indent + 1, table)) {
        continue;
      }
      if (sphere.props.count(propName)) {
        ss << print_prop(sphere.props.at(propName), propName, indent + 1);
        table.insert(propName);
        continue;
      }

      // not found
      ss << fmt::format(
          "# Property `{}` is described in `properties` Prim metadatum, but "
          "not found in this Prim. Possibly USDC file is corrupted.\n");
    }
  } else {
    // members
    ss << print_typed_attr(sphere.radius, "radius", indent + 1);

    ss << print_gprim_predefined(sphere, indent + 1);

    ss << print_props(sphere.props, indent + 1);
  }
#else

  ss << print_typed_attr(sphere.radius, "radius", indent + 1);

  ss << print_gprim_predefined(sphere, indent + 1);

  ss << print_props(sphere.props, indent + 1);

#endif

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}